

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmprofiletocsv.cpp
# Opt level: O2

void fmprofiletocsv::dostep(bool skipheader)

{
  size_t sVar1;
  undefined7 in_register_00000039;
  undefined8 in_R8;
  undefined8 in_R9;
  fm_profile_step q;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    printf("profile_id,calcrule_id,deductible1,deductible2,");
    printf("deductible3,attachment1,limit1,share1,share2,");
    printf("share3,step_id,calcrule_id,trigger_start,trigger_end,");
    printf("payout_start,payout_end,limit2,scale1,");
    puts("scale2");
  }
  q.trigger_end = 0.0;
  q.payout_start = 0.0;
  q.payout_end = 0.0;
  q.limit2 = 0.0;
  q.share2 = 0.0;
  q.share3 = 0.0;
  q.step_id = 0;
  q.trigger_start = 0.0;
  q.scale1 = 0.0;
  q.scale2 = 0.0;
  q.deductible3 = 0.0;
  q.attachment = 0.0;
  q.limit1 = 0.0;
  q.share1 = 0.0;
  q.profile_id = 0;
  q.calcrule_id = 0;
  q.deductible1 = 0.0;
  q.deductible2 = 0.0;
  sVar1 = fread(&q,0x48,1,_stdin);
  while (sVar1 != 0) {
    printf("%d,%d,%f,%f,%f,%f,%f,%f,%f,%f,%d,%f,%f,%f,%f,%f,%f,%f\n",SUB84((double)q.deductible1,0),
           (double)q.deductible2,(double)q.deductible3,(double)q.attachment,(double)q.limit1,
           (double)q.share1,(double)q.share2,(double)q.share3,q._0_8_ & 0xffffffff,
           (ulong)q._0_8_ >> 0x20,q._40_8_ & 0xffffffff,in_R8,in_R9,(double)q.trigger_start,
           (double)q.trigger_end,(double)q.payout_start,(double)q.payout_end,(double)q.limit2,
           (double)q.scale1,(double)q.scale2);
    sVar1 = fread(&q,0x48,1,_stdin);
  }
  return;
}

Assistant:

void dostep(bool skipheader) {
		if (skipheader == false) {
            printf("profile_id,calcrule_id,deductible1,deductible2,");
            printf("deductible3,attachment1,limit1,share1,share2,");
            printf("share3,step_id,calcrule_id,trigger_start,trigger_end,");
			printf("payout_start,payout_end,limit2,scale1,");
			printf("scale2\n");
		}

		fm_profile_step q;
		size_t i = fread(&q, sizeof(q), 1, stdin);
		while (i != 0) {
			printf("%d,%d,%f,%f,%f,%f,%f,%f,%f,%f,%d,%f,%f,%f,%f,%f,%f,%f\n", q.profile_id,
                q.calcrule_id, q.deductible1, q.deductible2, q.deductible3,
                q.attachment, q.limit1, q.share1, q.share2, q.share3,q.step_id,
				q.trigger_start, q.trigger_end, q.payout_start,
				q.payout_end, q.limit2, q.scale1, q.scale2);

			i = fread(&q, sizeof(q), 1, stdin);
		}
	}